

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O0

Ptr __thiscall core::image::rescale_half_size_gaussian<float>(image *this,ConstPtr *img,float sigma)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int chans;
  int width;
  int height;
  int iVar4;
  ImageBase *pIVar5;
  invalid_argument *this_00;
  TypedImageBase<float> *this_01;
  element_type *peVar6;
  int *piVar7;
  element_type *this_02;
  float *pfVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  float weight;
  float weight_00;
  float weight_01;
  float fVar10;
  double dVar11;
  Ptr PVar12;
  float local_e0;
  Accum<float> local_dc;
  Accum<float> accum;
  int c;
  int local_c8;
  int local_c4;
  int local_c0 [3];
  int local_b4;
  int xi [4];
  int x2;
  int x;
  int local_98;
  int local_94;
  int local_90 [2];
  float *local_88;
  float *row [4];
  int local_58;
  int y2;
  int y;
  int rowstride;
  int outpos;
  float w3;
  float w2;
  float w1;
  int oh;
  int ow;
  int ic;
  int ih;
  int iw;
  float sigma_local;
  ConstPtr *img_local;
  Ptr *out;
  
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)img);
  iVar2 = ImageBase::width(pIVar5);
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)img);
  iVar3 = ImageBase::height(pIVar5);
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)img);
  chans = ImageBase::channels(pIVar5);
  width = iVar2 + 1 >> 1;
  height = iVar3 + 1 >> 1;
  if ((1 < iVar2) && (1 < iVar3)) {
    Image<float>::create();
    this_01 = &std::
               __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this)->super_TypedImageBase<float>;
    TypedImageBase<float>::allocate(this_01,width,height,chans);
    dVar11 = std::exp((double)(ulong)(uint)(-0.5 / (sigma * sigma + sigma * sigma)));
    weight = SUB84(dVar11,0);
    dVar11 = std::exp((double)(ulong)(uint)(-2.5 / (sigma * sigma + sigma * sigma)));
    weight_00 = SUB84(dVar11,0);
    dVar11 = std::exp((double)(ulong)(uint)(-4.5 / (sigma * sigma + sigma * sigma)));
    weight_01 = SUB84(dVar11,0);
    y = 0;
    iVar4 = iVar2 * chans;
    _Var9._M_pi = extraout_RDX;
    for (local_58 = 0; local_58 < height; local_58 = local_58 + 1) {
      iVar1 = local_58 * 2;
      peVar6 = std::
               __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)img);
      local_90[1] = 0;
      local_90[0] = iVar1 + -1;
      piVar7 = std::max<int>(local_90 + 1,local_90);
      local_88 = Image<float>::at(peVar6,*piVar7 * iVar4);
      peVar6 = std::
               __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)img);
      row[0] = Image<float>::at(peVar6,iVar1 * iVar4);
      peVar6 = std::
               __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)img);
      local_94 = iVar3 + -1;
      local_98 = iVar1 + 1;
      piVar7 = std::min<int>(&local_94,&local_98);
      row[1] = Image<float>::at(peVar6,*piVar7 * iVar4);
      peVar6 = std::
               __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)img);
      x = iVar3 + -1;
      x2 = iVar1 + 2;
      piVar7 = std::min<int>(&x,&x2);
      row[2] = Image<float>::at(peVar6,*piVar7 * iVar4);
      _Var9._M_pi = extraout_RDX_00;
      for (xi[3] = 0; xi[3] < width; xi[3] = xi[3] + 1) {
        xi[2] = xi[3] * 2;
        local_c0[1] = 0;
        local_c0[0] = xi[2] + -1;
        piVar7 = std::max<int>(local_c0 + 1,local_c0);
        local_c0[2] = *piVar7 * chans;
        local_b4 = xi[2] * chans;
        local_c4 = iVar2 + -1;
        local_c8 = xi[2] + 1;
        piVar7 = std::min<int>(&local_c4,&local_c8);
        xi[0] = *piVar7 * chans;
        c = iVar2 + -1;
        accum.w = (float)(xi[2] + 2);
        piVar7 = std::min<int>(&c,(int *)&accum.w);
        xi[1] = *piVar7 * chans;
        _Var9._M_pi = extraout_RDX_01;
        for (accum.v = 0.0; (int)accum.v < chans; accum.v = (float)((int)accum.v + 1)) {
          local_e0 = 0.0;
          math::Accum<float>::Accum(&local_dc,&local_e0);
          math::Accum<float>::add(&local_dc,local_88 + (local_c0[2] + (int)accum.v),weight_01);
          math::Accum<float>::add(&local_dc,local_88 + (local_b4 + (int)accum.v),weight_00);
          math::Accum<float>::add(&local_dc,local_88 + (xi[0] + (int)accum.v),weight_00);
          math::Accum<float>::add(&local_dc,local_88 + (xi[1] + (int)accum.v),weight_01);
          math::Accum<float>::add(&local_dc,row[0] + (local_c0[2] + (int)accum.v),weight_00);
          math::Accum<float>::add(&local_dc,row[0] + (local_b4 + (int)accum.v),weight);
          math::Accum<float>::add(&local_dc,row[0] + (xi[0] + (int)accum.v),weight);
          math::Accum<float>::add(&local_dc,row[0] + (xi[1] + (int)accum.v),weight_00);
          math::Accum<float>::add(&local_dc,row[1] + (local_c0[2] + (int)accum.v),weight_00);
          math::Accum<float>::add(&local_dc,row[1] + (local_b4 + (int)accum.v),weight);
          math::Accum<float>::add(&local_dc,row[1] + (xi[0] + (int)accum.v),weight);
          math::Accum<float>::add(&local_dc,row[1] + (xi[1] + (int)accum.v),weight_00);
          math::Accum<float>::add(&local_dc,row[2] + (local_c0[2] + (int)accum.v),weight_01);
          math::Accum<float>::add(&local_dc,row[2] + (local_b4 + (int)accum.v),weight_00);
          math::Accum<float>::add(&local_dc,row[2] + (xi[0] + (int)accum.v),weight_00);
          math::Accum<float>::add(&local_dc,row[2] + (xi[1] + (int)accum.v),weight_01);
          fVar10 = math::Accum<float>::normalized(&local_dc);
          this_02 = std::
                    __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          pfVar8 = Image<float>::at(this_02,y);
          *pfVar8 = fVar10;
          _Var9._M_pi = extraout_RDX_02;
          y = y + 1;
        }
      }
    }
    PVar12.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var9._M_pi;
    PVar12.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar12.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Invalid input image");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

typename Image<T>::Ptr
rescale_half_size_gaussian (typename Image<T>::ConstPtr img, float sigma)
{
    int const iw = img->width();
    int const ih = img->height();
    int const ic = img->channels();
    int const ow = (iw + 1) >> 1;
    int const oh = (ih + 1) >> 1;

    if (iw < 2 || ih < 2)
        throw std::invalid_argument("Invalid input image");

    typename Image<T>::Ptr out(Image<T>::create());
    out->allocate(ow, oh, ic);

    /*
     * Weights w1 (4 center px), w2 (8 skewed px) and w3 (4 corner px).
     * Weights can be normalized by dividing with (4*w1 + 8*w2 + 4*w3).
     * Since the accumulator is used, normalization is not explicit.
     */
    float const w1 = std::exp(-0.5f / (2.0f * MATH_POW2(sigma)));
    float const w2 = std::exp(-2.5f / (2.0f * MATH_POW2(sigma)));
    float const w3 = std::exp(-4.5f / (2.0f * MATH_POW2(sigma)));

    int outpos = 0;
    int const rowstride = iw * ic;
    for (int y = 0; y < oh; ++y)
    {
        /* Init the four row pointers. */
        int y2 = (int)y << 1;
        T const* row[4];
        row[0] = &img->at(std::max(0, y2 - 1) * rowstride);
        row[1] = &img->at(y2 * rowstride);
        row[2] = &img->at(std::min((int)ih - 1, y2 + 1) * rowstride);
        row[3] = &img->at(std::min((int)ih - 1, y2 + 2) * rowstride);

        for (int x = 0; x < ow; ++x)
        {
            /* Init four pixel positions for each row. */
            int x2 = (int)x << 1;
            int xi[4];
            xi[0] = std::max(0, x2 - 1) * ic;
            xi[1] = x2 * ic;
            xi[2] = std::min((int)iw - 1, x2 + 1) * ic;
            xi[3] = std::min((int)iw - 1, x2 + 2) * ic;

            /* Accumulate 16 values in each channel. */
            for (int c = 0; c < ic; ++c)
            {
                math::Accum<T> accum(T(0));
                accum.add(row[0][xi[0] + c], w3);
                accum.add(row[0][xi[1] + c], w2);
                accum.add(row[0][xi[2] + c], w2);
                accum.add(row[0][xi[3] + c], w3);

                accum.add(row[1][xi[0] + c], w2);
                accum.add(row[1][xi[1] + c], w1);
                accum.add(row[1][xi[2] + c], w1);
                accum.add(row[1][xi[3] + c], w2);

                accum.add(row[2][xi[0] + c], w2);
                accum.add(row[2][xi[1] + c], w1);
                accum.add(row[2][xi[2] + c], w1);
                accum.add(row[2][xi[3] + c], w2);

                accum.add(row[3][xi[0] + c], w3);
                accum.add(row[3][xi[1] + c], w2);
                accum.add(row[3][xi[2] + c], w2);
                accum.add(row[3][xi[3] + c], w3);

                out->at(outpos++) = accum.normalized();
            }
        }
    }

    return out;
}